

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Rational *a)

{
  ostream *poVar1;
  ostream *in_RDI;
  Rational *in_stack_00000078;
  string local_30 [48];
  
  Rational::toString_abi_cxx11_(in_stack_00000078);
  poVar1 = std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Rational &a)
{
    return out << a.toString();
}